

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O2

int run_test_loop_handles(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_prepare_init(puVar2,&prepare_1_handle);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_prepare_start(&prepare_1_handle,(uv_prepare_cb)0x0);
    if (iVar1 != -0x16) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
              ,0x120,"r == UV_EINVAL");
      abort();
    }
    iVar1 = uv_prepare_start(&prepare_1_handle,prepare_1_cb);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_check_init(puVar2,&check_handle);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_check_start(&check_handle,check_cb);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_prepare_init(puVar2,&prepare_2_handle);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            lVar4 = 0;
            while( true ) {
              puVar2 = uv_default_loop();
              if (lVar4 == 0x268) break;
              iVar1 = uv_idle_init(puVar2,(uv_idle_t *)((long)&idle_1_handles[0].data + lVar4));
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a != 0) {
                pcVar6 = "0";
                pcVar5 = "r";
                uVar3 = 0x130;
                goto LAB_0015408a;
              }
              lVar4 = lVar4 + 0x58;
            }
            iVar1 = uv_timer_init(puVar2,&timer_handle);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              iVar1 = uv_timer_start(&timer_handle,timer_cb,100,100);
              eval_a = (int64_t)iVar1;
              eval_b = 0;
              if (eval_a == 0) {
                uv_unref((uv_handle_t *)&timer_handle);
                puVar2 = uv_default_loop();
                iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                eval_a = (int64_t)iVar1;
                eval_b = 0;
                if (eval_a == 0) {
                  eval_a = (int64_t)loop_iteration;
                  eval_b = 0x15;
                  if (eval_a == 0x15) {
                    eval_a = (int64_t)prepare_1_cb_called;
                    eval_b = 0x15;
                    if (eval_a == 0x15) {
                      eval_a = 1;
                      eval_b = (int64_t)prepare_1_close_cb_called;
                      if (eval_b == 1) {
                        eval_a = (int64_t)prepare_2_cb_called;
                        eval_b = 10;
                        if (eval_a == 10) {
                          eval_a = 1;
                          eval_b = (int64_t)prepare_2_close_cb_called;
                          if (eval_b == 1) {
                            eval_a = (int64_t)check_cb_called;
                            eval_b = 0x15;
                            if (eval_a == 0x15) {
                              eval_a = 1;
                              eval_b = (int64_t)check_close_cb_called;
                              if (eval_b == 1) {
                                eval_a = (int64_t)idle_1_close_cb_called;
                                eval_b = 7;
                                if (eval_a == 7) {
                                  eval_a = (int64_t)idle_2_close_cb_called;
                                  eval_b = (int64_t)idle_2_cb_started;
                                  if (eval_a == eval_b) {
                                    eval_a = (int64_t)idle_2_is_active;
                                    eval_b = 0;
                                    if (eval_a == 0) {
                                      puVar2 = uv_default_loop();
                                      uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                      uv_run(puVar2,UV_RUN_DEFAULT);
                                      eval_a = 0;
                                      puVar2 = uv_default_loop();
                                      iVar1 = uv_loop_close(puVar2);
                                      eval_b = (int64_t)iVar1;
                                      if (eval_b == 0) {
                                        uv_library_shutdown();
                                        return 0;
                                      }
                                      pcVar6 = "uv_loop_close(uv_default_loop())";
                                      pcVar5 = "0";
                                      uVar3 = 0x151;
                                    }
                                    else {
                                      pcVar6 = "0";
                                      pcVar5 = "idle_2_is_active";
                                      uVar3 = 0x14f;
                                    }
                                  }
                                  else {
                                    pcVar6 = "idle_2_cb_started";
                                    pcVar5 = "idle_2_close_cb_called";
                                    uVar3 = 0x14e;
                                  }
                                }
                                else {
                                  pcVar6 = "7";
                                  pcVar5 = "idle_1_close_cb_called";
                                  uVar3 = 0x14c;
                                }
                              }
                              else {
                                pcVar6 = "check_close_cb_called";
                                pcVar5 = "1";
                                uVar3 = 0x149;
                              }
                            }
                            else {
                              pcVar6 = "21";
                              pcVar5 = "check_cb_called";
                              uVar3 = 0x148;
                            }
                          }
                          else {
                            pcVar6 = "prepare_2_close_cb_called";
                            pcVar5 = "1";
                            uVar3 = 0x146;
                          }
                        }
                        else {
                          pcVar6 = "21 / 2";
                          pcVar5 = "prepare_2_cb_called";
                          uVar3 = 0x145;
                        }
                      }
                      else {
                        pcVar6 = "prepare_1_close_cb_called";
                        pcVar5 = "1";
                        uVar3 = 0x143;
                      }
                    }
                    else {
                      pcVar6 = "21";
                      pcVar5 = "prepare_1_cb_called";
                      uVar3 = 0x142;
                    }
                  }
                  else {
                    pcVar6 = "21";
                    pcVar5 = "loop_iteration";
                    uVar3 = 0x140;
                  }
                }
                else {
                  pcVar6 = "0";
                  pcVar5 = "r";
                  uVar3 = 0x13e;
                }
              }
              else {
                pcVar6 = "0";
                pcVar5 = "r";
                uVar3 = 0x13a;
              }
            }
            else {
              pcVar6 = "0";
              pcVar5 = "r";
              uVar3 = 0x138;
            }
          }
          else {
            pcVar6 = "0";
            pcVar5 = "r";
            uVar3 = 299;
          }
        }
        else {
          pcVar6 = "0";
          pcVar5 = "r";
          uVar3 = 0x127;
        }
      }
      else {
        pcVar6 = "0";
        pcVar5 = "r";
        uVar3 = 0x125;
      }
    }
    else {
      pcVar6 = "0";
      pcVar5 = "r";
      uVar3 = 0x122;
    }
  }
  else {
    pcVar6 = "0";
    pcVar5 = "r";
    uVar3 = 0x11e;
  }
LAB_0015408a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-loop-handles.c"
          ,uVar3,pcVar5,"==",pcVar6,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(loop_handles) {
  int i;
  int r;

  r = uv_prepare_init(uv_default_loop(), &prepare_1_handle);
  ASSERT_OK(r);
  r = uv_prepare_start(&prepare_1_handle, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_prepare_start(&prepare_1_handle, prepare_1_cb);
  ASSERT_OK(r);

  r = uv_check_init(uv_default_loop(), &check_handle);
  ASSERT_OK(r);
  r = uv_check_start(&check_handle, check_cb);
  ASSERT_OK(r);

  /* initialize only, prepare_2 is started by prepare_1_cb */
  r = uv_prepare_init(uv_default_loop(), &prepare_2_handle);
  ASSERT_OK(r);

  for (i = 0; i < IDLE_COUNT; i++) {
    /* initialize only, idle_1 handles are started by check_cb */
    r = uv_idle_init(uv_default_loop(), &idle_1_handles[i]);
    ASSERT_OK(r);
  }

  /* don't init or start idle_2, both is done by idle_1_cb */

  /* The timer callback is there to keep the event loop polling unref it as it
   * is not supposed to keep the loop alive */
  r = uv_timer_init(uv_default_loop(), &timer_handle);
  ASSERT_OK(r);
  r = uv_timer_start(&timer_handle, timer_cb, TIMEOUT, TIMEOUT);
  ASSERT_OK(r);
  uv_unref((uv_handle_t*)&timer_handle);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(loop_iteration, ITERATIONS);

  ASSERT_EQ(prepare_1_cb_called, ITERATIONS);
  ASSERT_EQ(1, prepare_1_close_cb_called);

  ASSERT_EQ(prepare_2_cb_called, ITERATIONS / 2);
  ASSERT_EQ(1, prepare_2_close_cb_called);

  ASSERT_EQ(check_cb_called, ITERATIONS);
  ASSERT_EQ(1, check_close_cb_called);

  /* idle_1_cb should be called a lot */
  ASSERT_EQ(idle_1_close_cb_called, IDLE_COUNT);

  ASSERT_EQ(idle_2_close_cb_called, idle_2_cb_started);
  ASSERT_OK(idle_2_is_active);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}